

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Array<Address>::Array(Array<Address> *this,Array<Address> *other)

{
  Address *pAVar1;
  Address *pAVar2;
  Address *pAVar3;
  
  (this->_begin).item = (Address *)0x0;
  (this->_end).item = (Address *)0x0;
  this->_capacity = 0;
  reserve(this,other->_capacity);
  pAVar2 = (this->_begin).item;
  pAVar1 = (other->_end).item;
  for (pAVar3 = (other->_begin).item; pAVar3 != pAVar1; pAVar3 = pAVar3 + 1) {
    *pAVar2 = *pAVar3;
    pAVar2 = pAVar2 + 1;
  }
  (this->_end).item = pAVar2;
  return;
}

Assistant:

Array(const Array& other) : _capacity(0)
  {
    reserve(other.capacity());
    T* dest = _begin.item;
    for(T* src = other._begin.item, * end = other._end.item; src != end; ++src, ++dest)
    {
#ifdef VERIFY
      VERIFY(new(dest)T(*src) == dest);
#else
      new(dest)T(*src);
#endif
    }
    _end.item = dest;
  }